

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O0

bool xmrig::NvmlLib::load(void)

{
  int iVar1;
  runtime_error *prVar2;
  exception *ex;
  
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetClockInfo,&pNvmlDeviceGetClockInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetCount,&pNvmlDeviceGetCount);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetFanSpeed,&pNvmlDeviceGetFanSpeed);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetHandleByIndex,&pNvmlDeviceGetHandleByIndex);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetPciInfo,&pNvmlDeviceGetPciInfo);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetPowerUsage,&pNvmlDeviceGetPowerUsage);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlDeviceGetTemperature,&pNvmlDeviceGetTemperature);
  if (iVar1 == -1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = uv_dlsym(nvmlLib,kNvmlInit,&pNvmlInit);
  if (iVar1 != -1) {
    iVar1 = uv_dlsym(nvmlLib,kNvmlShutdown,&pNvmlShutdown);
    if (iVar1 == -1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = uv_dlsym(nvmlLib,kNvmlSystemGetDriverVersion,&pNvmlSystemGetDriverVersion);
    if (iVar1 != -1) {
      iVar1 = uv_dlsym(nvmlLib,kNvmlSystemGetNVMLVersion,&pNvmlSystemGetNVMLVersion);
      if (iVar1 != -1) {
        uv_dlsym(nvmlLib,kNvmlDeviceGetFanSpeed_v2,&pNvmlDeviceGetFanSpeed_v2);
        iVar1 = (*pNvmlInit)();
        if (iVar1 == 0) {
          (*pNvmlSystemGetDriverVersion)(m_driverVersion,0x50);
          (*pNvmlSystemGetNVMLVersion)(m_nvmlVersion,0x50);
        }
        return iVar1 == 0;
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,kSymbolNotFound);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool xmrig::NvmlLib::load()
{
    try {
        DLSYM(NvmlDeviceGetClockInfo);
        DLSYM(NvmlDeviceGetCount);
        DLSYM(NvmlDeviceGetFanSpeed);
        DLSYM(NvmlDeviceGetHandleByIndex);
        DLSYM(NvmlDeviceGetPciInfo);
        DLSYM(NvmlDeviceGetPowerUsage);
        DLSYM(NvmlDeviceGetTemperature);
        DLSYM(NvmlInit);
        DLSYM(NvmlShutdown);
        DLSYM(NvmlSystemGetDriverVersion);
        DLSYM(NvmlSystemGetNVMLVersion);
    } catch (std::exception &ex) {
        return false;
    }

    uv_dlsym(&nvmlLib, kNvmlDeviceGetFanSpeed_v2, reinterpret_cast<void**>(&pNvmlDeviceGetFanSpeed_v2));

    if (pNvmlInit() != NVML_SUCCESS) {
        return false;
    }

    pNvmlSystemGetDriverVersion(m_driverVersion, sizeof(m_driverVersion));
    pNvmlSystemGetNVMLVersion(m_nvmlVersion, sizeof(m_nvmlVersion));

    return true;
}